

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_unsupported_instruction_Test::
~CpuTest_unsupported_instruction_Test(CpuTest_unsupported_instruction_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, unsupported_instruction) {
    // This opcode should not be used as it jams the machine according to
    // http://atarihq.com/danb/files/64doc.txt
    stage_instruction(0x02);

    EXPECT_THAT([this]() { step_execution(1); },
            testing::Throws<std::logic_error>(
                    testing::Property(&std::logic_error::what,
                            testing::HasSubstr("Bad instruction: 0x02 @ 0"))));
}